

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<unsigned_char>::NFA(NFA<unsigned_char> *this)

{
  CharClass<unsigned_char> local_40;
  NFA<unsigned_char> *local_10;
  NFA<unsigned_char> *this_local;
  
  local_10 = this;
  NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::NFABase
            (&this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>);
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFA_00285770;
  std::
  vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ::emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states);
  CharClass<unsigned_char>::CharClass(&local_40);
  add_state(this,&local_40);
  CharClass<unsigned_char>::~CharClass(&local_40);
  return;
}

Assistant:

NFA()
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
    }